

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy_allocator.h
# Opt level: O2

int cppcms::impl::buddy_allocator::containts_bits(size_t n)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  iVar1 = 0x3f;
  lVar2 = 0x3e;
  do {
    if (lVar2 == 0) {
      return -1;
    }
    uVar3 = 2L << ((byte)lVar2 & 0x3f);
    iVar1 = iVar1 + -1;
    lVar2 = lVar2 + -1;
  } while (uVar3 <= n || n < uVar3 >> 1);
  return iVar1;
}

Assistant:

static int containts_bits(size_t n)
	{
		for(int i=sizeof(n)*8-2;i>0;i--)  {
			size_t upper = size_t(1) << (i + 1);
			size_t lower = upper / 2;
			if(lower <= n && n< upper)
				return i;
		}
		return -1;
		
	}